

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.h
# Opt level: O3

void __thiscall
rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::Clear
          (MemoryPoolAllocator<rapidjson::CrtAllocator> *this)

{
  ChunkHeader *__ptr;
  ChunkHeader *pCVar1;
  bool bVar2;
  
  pCVar1 = this->chunkHead_;
  bVar2 = pCVar1 == (ChunkHeader *)this->userBuffer_;
  __ptr = pCVar1;
  if (pCVar1 != (ChunkHeader *)0x0 && !bVar2) {
    do {
      pCVar1 = __ptr->next;
      free(__ptr);
      this->chunkHead_ = pCVar1;
      bVar2 = pCVar1 == (ChunkHeader *)this->userBuffer_;
      if (pCVar1 == (ChunkHeader *)0x0) break;
      __ptr = pCVar1;
    } while (pCVar1 != (ChunkHeader *)this->userBuffer_);
  }
  if ((bool)(pCVar1 != (ChunkHeader *)0x0 & bVar2)) {
    pCVar1->size = 0;
  }
  return;
}

Assistant:

void Clear() {
        while (chunkHead_ && chunkHead_ != userBuffer_) {
            ChunkHeader* next = chunkHead_->next;
            baseAllocator_->Free(chunkHead_);
            chunkHead_ = next;
        }
        if (chunkHead_ && chunkHead_ == userBuffer_)
            chunkHead_->size = 0; // Clear user buffer
    }